

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

bool __thiscall Board::isSolveable(Board *this)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  const_reference pvVar4;
  tile_index local_1c;
  Board *pBStack_18;
  uint i;
  Board *this_local;
  
  local_1c = 0;
  pBStack_18 = this;
  while( true ) {
    uVar2 = (ulong)local_1c;
    sVar3 = std::vector<Tile,_std::allocator<Tile>_>::size(&this->_tiles);
    if (sVar3 <= uVar2) {
      return true;
    }
    pvVar4 = std::vector<Tile,_std::allocator<Tile>_>::operator[](&this->_tiles,(ulong)local_1c);
    if ((pvVar4->status != Empty) && (bVar1 = isTileInsertionValid(this,&local_1c), !bVar1)) break;
    local_1c = local_1c + 1;
  }
  return false;
}

Assistant:

const bool Board::isSolveable() const
{
	for (unsigned int i = 0; i < _tiles.size(); i++)
	{
		if (_tiles[i].status != TileStatus::Empty && !isTileInsertionValid(i))
			return false;
	}

	return true;
}